

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

int methodIndexToSignalIndex(QMetaObject **base,int signal_index)

{
  QMetaObject *pQVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  QMetaObject *this;
  int iVar5;
  
  this = (QMetaObject *)base;
  if (-1 < signal_index) {
    do {
      this = (this->d).superdata.direct;
      if (this == (QMetaObject *)0x0) {
        return signal_index;
      }
      iVar3 = QMetaObject::methodOffset(this);
    } while (signal_index < iVar3);
    iVar5 = 0;
    iVar3 = 0;
    for (pQVar1 = (this->d).superdata.direct; pQVar1 != (QMetaObject *)0x0;
        pQVar1 = (pQVar1->d).superdata.direct) {
      puVar2 = (pQVar1->d).data;
      iVar3 = iVar3 + puVar2[4];
      iVar5 = iVar5 + puVar2[0xd];
    }
    iVar4 = QMetaObject::methodCount(this);
    iVar3 = signal_index - iVar3;
    if (signal_index < iVar4) {
      iVar3 = QMetaObjectPrivate::originalClone(this,iVar3);
    }
    signal_index = iVar3 + iVar5;
    *base = this;
  }
  return signal_index;
}

Assistant:

static int methodIndexToSignalIndex(const QMetaObject **base, int signal_index)
{
    if (signal_index < 0)
        return signal_index;
    const QMetaObject *metaObject = *base;
    while (metaObject && metaObject->methodOffset() > signal_index)
        metaObject = metaObject->superClass();

    if (metaObject) {
        int signalOffset, methodOffset;
        computeOffsets(metaObject, &signalOffset, &methodOffset);
        if (signal_index < metaObject->methodCount())
            signal_index = QMetaObjectPrivate::originalClone(metaObject, signal_index - methodOffset) + signalOffset;
        else
            signal_index = signal_index - methodOffset + signalOffset;
        *base = metaObject;
    }
    return signal_index;
}